

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltcalc.cpp
# Opt level: O3

void eltcalc::doit(bool skipHeader,bool ordOutput,FILE **fout,
                  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *parquetFileNames)

{
  size_t sVar1;
  FILE *__stream;
  undefined7 in_register_00000031;
  eltcalc *this;
  uint samplesize;
  uint stream_type;
  uint summaryset_id;
  int local_3c;
  uint local_38;
  undefined1 local_34 [4];
  
  local_38 = 0;
  fread(&local_38,4,1,_stdin);
  if (((int)CONCAT71(in_register_00000031,ordOutput) != 0) && (*fout != (FILE *)0x0)) {
    GetEventRates();
  }
  this = (eltcalc *)(ulong)local_38;
  if ((~local_38 & 0x3000000) == 0) {
    sVar1 = fread(&local_3c,4,1,_stdin);
    if ((ordOutput) && (fout[1] != (FILE *)0x0)) {
      GetIntervals(local_3c);
    }
    if (sVar1 == 1) {
      sVar1 = fread(local_34,4,1,_stdin);
      if (sVar1 == 1) {
        doeltoutput(local_3c,skipHeader,ordOutput,fout,parquetFileNames);
        return;
      }
    }
    doit();
    return;
  }
  doit(this);
  __stream = fopen(*(char **)this,"wb");
  fclose(__stream);
  return;
}

Assistant:

void doit(bool skipHeader, bool ordOutput, FILE **fout,
		  std::map<int, std::string> &parquetFileNames)
	{
		unsigned int stream_type = 0;
		size_t i = fread(&stream_type, sizeof(stream_type), 1, stdin);

#ifdef HAVE_PARQUET
		if ((ordOutput && fout[MELT] != nullptr) ||
		    parquetFileNames.find(OasisParquet::MELT) != parquetFileNames.end()) {
			GetEventRates();
		}
#else
		if (ordOutput && fout[MELT] != nullptr) GetEventRates();
#endif

		if (isSummaryCalcStream(stream_type) == true) {
			unsigned int samplesize;
			unsigned int summaryset_id;
			i = fread(&samplesize, sizeof(samplesize), 1, stdin);

#ifdef HAVE_PARQUET
			if ((ordOutput && fout[QELT] != nullptr) ||
			    parquetFileNames.find(OasisParquet::QELT) != parquetFileNames.end()) {
				GetIntervals(samplesize);
			}
#else
			if (ordOutput && fout[QELT] != nullptr) GetIntervals(samplesize);
#endif

			if (i == 1) i = fread(&summaryset_id,
					      sizeof(summaryset_id), 1, stdin);
			if (i == 1) {
				doeltoutput(samplesize, skipHeader, ordOutput,
					    fout, parquetFileNames);
			}
			else {
				fprintf(stderr, "FATAL: Stream read error\n");
			}
			return;
		}

		fprintf(stderr, "FATAL: %s: Not a gul stream\n", __func__);
		fprintf(stderr, "FATAL: %s: invalid stream type %d\n", __func__, stream_type);
		exit(-1);
	}